

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

long PSGPitchConvert(long pitch)

{
  uint uVar1;
  
  if (source_driver < 3 && 2 < target_driver) {
    uVar1 = (int)pitch + 0xc;
  }
  else {
    if (source_driver < 3 || 2 < target_driver) {
      return pitch;
    }
    uVar1 = (int)pitch + 0xf4;
  }
  return (ulong)(uVar1 & 0xff);
}

Assistant:

static long PSGPitchConvert(long pitch)
{
	long value;

	if (target_driver >= 3 && source_driver < 3)
		value = (pitch + PSG_DELTA) & 0xFF;
	else if (target_driver < 3 && source_driver >= 3)
		value = (pitch - PSG_DELTA) & 0xFF;
	else
		value = pitch;

	return value;
}